

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
* __thiscall
jessilib::
split_once<std::__cxx11::u16string,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t>
          (pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          begin,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                end,char16_t in_delim)

{
  pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *this_00;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  in_end;
  pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  result;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> bStack_88;
  pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_68;
  
  local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
  local_68.first._M_string_length = 0;
  local_68.first.field_2._M_local_buf[0] = L'\0';
  local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
  local_68.second._M_string_length = 0;
  local_68.second.field_2._M_local_buf[0] = L'\0';
  if (this < begin._M_current) {
    this_00 = (pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               *)&local_68.second;
    for (in_end._M_current = (char16_t *)this; in_end._M_current != begin._M_current;
        in_end._M_current = in_end._M_current + 1) {
      if (*in_end._M_current == (char16_t)end._M_current) {
        make_split_member<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_nullptr>
                  (&bStack_88,
                   (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                    )this,in_end);
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::operator=(&local_68.first,&bStack_88);
        std::__cxx11::u16string::~u16string((u16string *)&bStack_88);
        make_split_member<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_nullptr>
                  (&bStack_88,
                   (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                    )(in_end._M_current + 1),begin);
        goto LAB_002bb732;
      }
    }
    make_split_member<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_nullptr>
              (&bStack_88,
               (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )this,begin);
    this_00 = &local_68;
LAB_002bb732:
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=(&this_00->first,&bStack_88);
    std::__cxx11::u16string::~u16string((u16string *)&bStack_88);
  }
  std::
  pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::pair(__return_storage_ptr__,&local_68);
  std::
  pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::~pair(&local_68);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}